

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore_adf.cc
# Opt level: O1

void CB_EXPLORE_ADF::predict_or_learn_cover<false>
               (cb_explore_adf *data,multi_learner *base,multi_ex *examples)

{
  pointer *ppfVar1;
  float fVar2;
  example *peVar3;
  pointer pfVar4;
  iterator __position;
  action_score *paVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  float *__args;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  double __x;
  undefined1 auVar14 [16];
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double dVar21;
  undefined1 auVar18 [16];
  float fVar22;
  undefined1 local_98 [8];
  undefined4 uStack_90;
  undefined4 uStack_8c;
  action_score local_68;
  action_score *local_60;
  undefined1 local_58 [16];
  pointer_____offset_0x10___ *local_40;
  action_score *local_38;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  
  GEN_CS::gen_cs_example_ips(examples,&data->cs_labels);
  LEARNER::multiline_learn_or_predict<false>(base,examples,data->offset,0);
  peVar3 = *(examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  uVar10 = (long)(peVar3->pred).scalars._end - (long)(peVar3->pred).scalars._begin >> 3;
  uVar12 = data->cover_size;
  uVar13 = uVar10 & 0xffffffff;
  lVar6 = data->counter * uVar13;
  auVar16._8_4_ = (int)((ulong)lVar6 >> 0x20);
  auVar16._0_8_ = lVar6;
  auVar16._12_4_ = 0x45300000;
  dVar21 = auVar16._8_8_ - 1.9342813113834067e+25;
  __x = dVar21 + ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0);
  if (__x < 0.0) {
    auVar14._0_8_ = sqrt(__x);
    auVar14._8_8_ = extraout_XMM0_Qb;
  }
  else {
    auVar14._0_8_ = SQRT(__x);
    auVar14._8_8_ = dVar21;
  }
  local_58 = ZEXT416((uint)(float)uVar13);
  auVar15._4_12_ = auVar14._4_12_;
  auVar15._0_4_ = (float)auVar14._0_8_;
  v_array<ACTION_SCORE::action_score>::clear(&data->action_probs);
  uVar8 = (uint)uVar10;
  if (uVar8 != 0) {
    uVar11 = 0;
    do {
      local_68.score = 0.0;
      local_68.action = uVar11;
      v_array<ACTION_SCORE::action_score>::push_back(&data->action_probs,&local_68);
      uVar11 = uVar11 + 1;
    } while (uVar8 != uVar11);
  }
  auVar19._0_8_ = auVar15._0_8_;
  auVar19._12_4_ = auVar14._12_4_;
  auVar19._8_4_ = auVar14._4_4_;
  auVar18._8_8_ = auVar19._8_8_;
  auVar18._4_4_ = local_58._0_4_;
  auVar18._0_4_ = auVar15._0_4_;
  auVar20._0_12_ = auVar18._0_12_;
  auVar20._12_4_ = local_58._4_4_;
  _local_98 = ZEXT816(0x3f8000003f800000);
  pfVar4 = (data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish != pfVar4) {
    (data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
    ._M_finish = pfVar4;
  }
  auVar16 = divps(_local_98,auVar20);
  if (uVar8 != 0) {
    lVar6 = 0;
    do {
      __args = (float *)((long)(peVar3->pred).scalars._begin + lVar6 + 4);
      __position._M_current =
           (data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                  ((vector<float,std::allocator<float>> *)&data->scores,__position,__args);
      }
      else {
        *__position._M_current = *__args;
        ppfVar1 = &(data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppfVar1 = *ppfVar1 + 1;
      }
      lVar6 = lVar6 + 8;
    } while (uVar13 * 8 - lVar6 != 0);
  }
  local_98._4_4_ = auVar16._4_4_;
  fVar22 = 1.0 / (float)uVar12;
  if (data->first_only == false) {
    paVar5 = (peVar3->pred).a_s._begin;
    lVar6 = (long)(peVar3->pred).scalars._end - (long)paVar5;
    if (lVar6 == 0) {
      uVar12 = 0;
    }
    else {
      uVar7 = lVar6 >> 3;
      uVar10 = 1;
      uVar12 = uVar10;
      if (1 < uVar7) {
        do {
          uVar12 = uVar10;
          if ((paVar5[uVar10].score != paVar5->score) ||
             (NAN(paVar5[uVar10].score) || NAN(paVar5->score))) break;
          uVar10 = uVar10 + 1;
          uVar12 = uVar7;
        } while (uVar7 != uVar10);
      }
    }
    if (uVar12 != 0) {
      uVar10 = 0;
      do {
        fVar2 = (peVar3->pred).scalars._begin[uVar10 * 2];
        paVar5 = (data->action_probs)._begin;
        paVar5[(uint)fVar2].score = paVar5[(uint)fVar2].score + fVar22 / (float)uVar12;
        uVar10 = uVar10 + 1;
      } while (uVar12 != uVar10);
    }
  }
  else {
    uVar11 = ((peVar3->pred).a_s._begin)->action;
    paVar5 = (data->action_probs)._begin;
    paVar5[uVar11].score = paVar5[uVar11].score + fVar22;
  }
  local_98._0_4_ = auVar16._0_4_;
  uStack_90 = auVar16._8_4_;
  uStack_8c = auVar16._12_4_;
  if ((float)local_98._4_4_ <= (float)local_98._0_4_) {
    local_98._0_4_ = local_98._4_4_;
  }
  if (1 < data->cover_size) {
    uVar12 = 1;
    do {
      uVar12 = uVar12 + 1;
      GEN_CS::call_cs_ldf<false>
                (data->cs_ldf_learner,examples,&data->cb_labels,&data->cs_labels,
                 &data->prepped_cs_labels,data->offset,uVar12);
      if (uVar8 != 0) {
        uVar10 = 0;
        do {
          pfVar4 = (data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pfVar4[uVar10] = (peVar3->pred).a_s._begin[uVar10].score + pfVar4[uVar10];
          uVar10 = uVar10 + 1;
        } while (uVar13 != uVar10);
      }
      if (data->first_only == false) {
        paVar5 = (peVar3->pred).a_s._begin;
        lVar6 = (long)(peVar3->pred).scalars._end - (long)paVar5;
        if (lVar6 == 0) {
          uVar10 = 0;
        }
        else {
          uVar9 = lVar6 >> 3;
          uVar7 = 1;
          uVar10 = uVar7;
          if (1 < uVar9) {
            do {
              uVar10 = uVar7;
              if ((paVar5[uVar7].score != paVar5->score) ||
                 (NAN(paVar5[uVar7].score) || NAN(paVar5->score))) break;
              uVar7 = uVar7 + 1;
              uVar10 = uVar9;
            } while (uVar9 != uVar7);
          }
        }
        if (uVar10 != 0) {
          uVar7 = 0;
          do {
            fVar2 = (peVar3->pred).scalars._begin[uVar7 * 2];
            paVar5 = (data->action_probs)._begin;
            paVar5[(uint)fVar2].score = paVar5[(uint)fVar2].score + fVar22 / (float)uVar10;
            uVar7 = uVar7 + 1;
          } while (uVar10 != uVar7);
        }
      }
      else {
        uVar11 = ((peVar3->pred).a_s._begin)->action;
        paVar5 = (data->action_probs)._begin;
        paVar5[uVar11].score = paVar5[uVar11].score + fVar22;
      }
    } while (uVar12 < data->cover_size);
  }
  auVar17._4_12_ = local_98._4_12_;
  auVar17._0_4_ = (float)local_98._0_4_ * (float)local_58._0_4_;
  local_60 = (data->action_probs)._begin;
  local_38 = (data->action_probs)._end;
  local_68 = (action_score)
             &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  local_40 = &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  exploration::enforce_minimum_probability<ACTION_SCORE::score_iterator>
            (auVar17._0_8_,data->nounif ^ 1);
  do_sort(data);
  if (uVar13 != 0) {
    uVar12 = 0;
    do {
      *(action_score *)((peVar3->pred).scalars._begin + uVar12 * 2) =
           (data->action_probs)._begin[uVar12];
      uVar12 = uVar12 + 1;
    } while (uVar13 != uVar12);
  }
  data->counter = data->counter + 1;
  return;
}

Assistant:

void predict_or_learn_cover(cb_explore_adf& data, multi_learner& base, multi_ex& examples)
{
  // Randomize over predictions from a base set of predictors
  // Use cost sensitive oracle to cover actions to form distribution.
  const bool is_mtr = data.gen_cs.cb_type == CB_TYPE_MTR;
  if (is_learn)
  {
    if (is_mtr)  // use DR estimates for non-ERM policies in MTR
      GEN_CS::gen_cs_example_dr<true>(data.gen_cs, examples, data.cs_labels);
    else
      GEN_CS::gen_cs_example<false>(data.gen_cs, examples, data.cs_labels);
    multiline_learn_or_predict<true>(base, examples, data.offset);
  }
  else
  {
    GEN_CS::gen_cs_example_ips(examples, data.cs_labels);
    multiline_learn_or_predict<false>(base, examples, data.offset);
  }

  v_array<action_score>& preds = examples[0]->pred.a_s;
  const uint32_t num_actions = (uint32_t)preds.size();

  float additive_probability = 1.f / (float)data.cover_size;
  const float min_prob = min(1.f / num_actions, 1.f / (float)sqrt(data.counter * num_actions));
  v_array<action_score>& probs = data.action_probs;
  probs.clear();
  for (uint32_t i = 0; i < num_actions; i++) probs.push_back({i, 0.});
  data.scores.clear();
  for (uint32_t i = 0; i < num_actions; i++) data.scores.push_back(preds[i].score);

  if (!data.first_only)
  {
    size_t tied_actions = fill_tied(data, preds);
    for (size_t i = 0; i < tied_actions; ++i) probs[preds[i].action].score += additive_probability / tied_actions;
  }
  else
    probs[preds[0].action].score += additive_probability;

  float norm = min_prob * num_actions + (additive_probability - min_prob);
  for (size_t i = 1; i < data.cover_size; i++)
  {
    // Create costs of each action based on online cover
    if (is_learn)
    {
      data.cs_labels_2.costs.clear();
      for (uint32_t j = 0; j < num_actions; j++)
      {
        float pseudo_cost = data.cs_labels.costs[j].x - data.psi * min_prob / (max(probs[j].score, min_prob) / norm);
        data.cs_labels_2.costs.push_back({pseudo_cost, j, 0., 0.});
      }
      GEN_CS::call_cs_ldf<true>(*(data.cs_ldf_learner), examples, data.cb_labels, data.cs_labels_2,
          data.prepped_cs_labels, data.offset, i + 1);
    }
    else
      GEN_CS::call_cs_ldf<false>(
          *(data.cs_ldf_learner), examples, data.cb_labels, data.cs_labels, data.prepped_cs_labels, data.offset, i + 1);

    for (uint32_t i = 0; i < num_actions; i++) data.scores[i] += preds[i].score;
    if (!data.first_only)
    {
      size_t tied_actions = fill_tied(data, preds);
      const float add_prob = additive_probability / tied_actions;
      for (size_t i = 0; i < tied_actions; ++i)
      {
        if (probs[preds[i].action].score < min_prob)
          norm += max(0, add_prob - (min_prob - probs[preds[i].action].score));
        else
          norm += add_prob;
        probs[preds[i].action].score += add_prob;
      }
    }
    else
    {
      uint32_t action = preds[0].action;
      if (probs[action].score < min_prob)
        norm += max(0, additive_probability - (min_prob - probs[action].score));
      else
        norm += additive_probability;
      probs[action].score += additive_probability;
    }
  }

  enforce_minimum_probability(min_prob * num_actions, !data.nounif, begin_scores(probs), end_scores(probs));

  do_sort(data);
  for (size_t i = 0; i < num_actions; i++) preds[i] = probs[i];

  ++data.counter;
}